

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall arealights::Application::onUpdate(Application *this,duration *deltaTime)

{
  ofstream *poVar1;
  pointer ppVar2;
  element_type *peVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  int iVar8;
  pointer ppVar9;
  float fVar10;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_88 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  materialNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this->_frame = this->_frame + 1;
  fw::ImGuiApplication::onUpdate(&this->super_ImGuiApplication,deltaTime);
  (this->_cameraInputMapper)._locked = this->_cameraLocked;
  FreeCameraInputMapper::update(&this->_cameraInputMapper,deltaTime);
  this->_restartIncrementalRendering = (this->_cameraInputMapper)._hadMovement;
  Interface::render(&this->_interface);
  this->_restartIncrementalRendering = (this->_cameraInputMapper)._hadMovement;
  materialNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materialNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  materialNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar2 = (this->_materialMap).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar9 = (this->_materialMap).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar2; ppVar9 = ppVar9 + 1) {
    std::__cxx11::string::string((string *)&local_88[0].field_0,(string *)ppVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&materialNames,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_88[0].field_0);
    std::__cxx11::string::~string((string *)&local_88[0].field_0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,&materialNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->_interface)._materialNames,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  peVar3 = (this->_keyboardInput).
           super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = (*(peVar3->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar3,0x50);
  if ((char)iVar5 != '\0') {
    this->_screenshotRequested = true;
    std::__cxx11::string::assign((char *)&this->_screenshotAnnotation);
  }
  peVar3 = (this->_keyboardInput).
           super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = (*(peVar3->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar3,0x49);
  if ((char)iVar5 != '\0') {
    this->_restartIncrementalRendering = true;
  }
  peVar3 = (this->_keyboardInput).
           super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = (*(peVar3->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar3,0x4c);
  if ((char)iVar5 != '\0') {
    this->_cameraLocked = (bool)(this->_cameraLocked ^ 1);
  }
  peVar3 = (this->_keyboardInput).
           super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = (*(peVar3->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar3,0x31);
  if ((char)iVar5 != '\0') {
    local_88[0]._0_8_ = 0x40000000400;
    fw::OpenGLApplication::setWindowSize((OpenGLApplication *)this,(ivec2 *)&local_88[0].field_0);
  }
  peVar3 = (this->_keyboardInput).
           super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = (*(peVar3->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar3,0x32);
  if ((char)iVar5 != '\0') {
    local_88[0]._0_8_ = 0x3e860a92;
    local_88[0].field_0.z = 0.0;
    fw::FreeCamera::setEulerAngles
              ((this->_camera).super___shared_ptr<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,(vec3 *)&local_88[0].field_0);
    local_88[0]._0_8_ = 0x3f00000000000000;
    local_88[0].field_0.z = 5.0;
    fw::FreeCamera::setWorldPosition
              ((this->_camera).super___shared_ptr<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,(vec3 *)&local_88[0].field_0);
  }
  peVar3 = (this->_keyboardInput).
           super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = (*(peVar3->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar3,0x33);
  if ((char)iVar5 != '\0') {
    local_88[0]._0_8_ = 0xbf490fdb00000000;
    local_88[0].field_0.z = 0.0;
    fw::FreeCamera::setEulerAngles
              ((this->_camera).super___shared_ptr<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,(vec3 *)&local_88[0].field_0);
    local_88[0]._0_8_ = 0x3e99999a40a00000;
    local_88[0].field_0.z = 5.0;
    fw::FreeCamera::setWorldPosition
              ((this->_camera).super___shared_ptr<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,(vec3 *)&local_88[0].field_0);
  }
  peVar3 = (this->_keyboardInput).
           super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = (*(peVar3->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar3,0x35);
  if ((char)iVar5 == '\0') {
    if ((this->_autoscreenshot & 1U) == 0) goto LAB_0010e042;
  }
  else {
    this->_autoscreenshot = true;
    this->_autoscreenshotStep = 0;
    this->_autoscreenshotFrame = 0;
  }
  iVar5 = this->_autoscreenshotStep;
  if (iVar5 < 6) {
    iVar6 = this->_autoscreenshotFrame;
    if (iVar6 == 0 && iVar5 == 0) {
      std::ofstream::open((char *)&this->_autoscreenshotOutFile,0x18d8ce);
      iVar5 = this->_autoscreenshotStep;
      iVar6 = this->_autoscreenshotFrame;
    }
    iVar8 = 5;
    if ((this->_interface)._selectedArealightMethod == AREALIGHT_GROUNDTRUTH) {
      iVar8 = 1000;
    }
    this->_timeSum = this->_frameTimeMs + this->_timeSum;
    if (iVar6 == (iVar5 + 1) * iVar8) {
      poVar1 = &this->_autoscreenshotOutFile;
      poVar7 = std::operator<<((ostream *)poVar1,"method=");
      std::ostream::operator<<(poVar7,(this->_interface)._selectedArealightMethod);
      poVar7 = std::operator<<((ostream *)poVar1,"\rroughness=");
      fVar10 = (float)this->_autoscreenshotStep * 0.2;
      if (fVar10 <= 0.05) {
        fVar10 = 0.05;
      }
      std::ostream::operator<<(poVar7,fVar10);
      poVar7 = std::operator<<((ostream *)poVar1,"\rtime=");
      fVar10 = this->_timeSum;
      if ((this->_interface)._selectedArealightMethod != AREALIGHT_GROUNDTRUTH) {
        fVar10 = fVar10 / (float)iVar8;
      }
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,fVar10);
      std::endl<char,std::char_traits<char>>(poVar7);
      iVar6 = this->_autoscreenshotFrame;
      iVar5 = this->_autoscreenshotStep + 1;
      this->_autoscreenshotStep = iVar5;
    }
    if ((iVar5 < 6) && (iVar6 == iVar5 * iVar8)) {
      fVar10 = (float)iVar5 * 0.2;
      if (fVar10 <= 0.05) {
        fVar10 = 0.05;
      }
      (this->_interface)._roughness = fVar10;
      this->_timeSum = 0.0;
      this->_restartIncrementalRendering = true;
    }
    if (iVar6 == (iVar5 + 1) * iVar8 + -1) {
      this->_screenshotRequested = true;
    }
    this->_autoscreenshotFrame = iVar6 + 1;
  }
  else {
    this->_autoscreenshot = false;
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 != '\0') {
      std::operator<<((ostream *)&this->_autoscreenshotOutFile,"Closing.");
      std::ofstream::close();
    }
  }
LAB_0010e042:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&materialNames);
  return;
}

Assistant:

void Application::onUpdate(
    const std::chrono::high_resolution_clock::duration& deltaTime
)
{
    ++_frame;

    ImGuiApplication::onUpdate(deltaTime);

    _cameraInputMapper.setLock(_cameraLocked);
    _cameraInputMapper.update(deltaTime);
    _restartIncrementalRendering = _cameraInputMapper.hadMovement();

    _interface.render();

    _restartIncrementalRendering = _cameraInputMapper.hadMovement();

    std::vector<std::string> materialNames;
    std::transform(std::begin(_materialMap), std::end(_materialMap), std::back_inserter(materialNames),
        [](const std::pair<std::string, std::shared_ptr<Material>> &p) { return p.first; });

    _interface.setMaterials(materialNames);

    if (_keyboardInput->isKeyTapped(GLFW_KEY_P)) {
        _screenshotRequested = true;
        _screenshotAnnotation = "";
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_I)) {
        _restartIncrementalRendering = true;
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_L)) {
        _cameraLocked = !_cameraLocked;
    }

    // Automate screenshot taking

    if (_keyboardInput->isKeyTapped(GLFW_KEY_1)) {
        this->setWindowSize({1024, 1024});
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_2)) {
        _camera->setEulerAngles({M_PI*(1.0/12.0), 0, 0});
        _camera->setWorldPosition({0, 0.5, 5});
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_3)) {
        _camera->setEulerAngles({0, -M_PI_4, 0});
        _camera->setWorldPosition({5, 0.3, 5});
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_5)) {
        _autoscreenshot = true;
        _autoscreenshotStep = 0;
        _autoscreenshotFrame = 0;
    }

    /*
    // Average time measurements
    if (_keyboardInput->isKeyTapped(GLFW_KEY_M)) {
        _measure = true;
        _measureAccumulator = 0.0f;
        _measureFramesNum = 0;
    }

    if (_measure) {
        if (_measureFramesNum < 100) {
            _measureAccumulator += _frameTimeMs;
            ++_measureFramesNum;
        } else {
            _measure = false;
            _lastMeasurement = _measureAccumulator / 100.0f;
        }
    }

    ImGui::Text("Last measurement: %.4f", _lastMeasurement);
    */


    // Autoscreenshoting for paper purposes
    if (_autoscreenshot) {
        if (_autoscreenshotStep <= 5) {
            if (_autoscreenshotStep == 0 && _autoscreenshotFrame == 0) {
                _autoscreenshotOutFile.open("autoscreenshot_log.txt", std::ios_base::app);
            }

            const int numFrames = _interface.getArealightMethod() == AREALIGHT_GROUNDTRUTH ? 1000 : 5;

            _timeSum += _frameTimeMs;

            // finalize previous step - all frames done for this one
            if (_autoscreenshotFrame == numFrames * (_autoscreenshotStep+1)) {
                // log time
                _autoscreenshotOutFile << "method=" << static_cast<int>(_interface.getArealightMethod());
                _autoscreenshotOutFile << "\rroughness=" << std::max(0.05f, _autoscreenshotStep * 0.2f);
                _autoscreenshotOutFile << "\rtime=" << (_interface.getArealightMethod() == AREALIGHT_GROUNDTRUTH ?
                    _timeSum :
                    _timeSum / numFrames) << std::endl;
                // go to next step
                ++_autoscreenshotStep;
            }

            // first frame of the new step
            if (_autoscreenshotStep <= 5 && _autoscreenshotFrame == numFrames * _autoscreenshotStep) {
                _interface.setRoughness(std::max(0.05f, _autoscreenshotStep * 0.2f));
                _timeSum = 0.0;
                _restartIncrementalRendering = true;
            }

            // ground truth needs a few frames, that's why there is a waiting period, also for other methods we
            // calculate average for gen time
            // last frame of current step
            if (_autoscreenshotFrame == numFrames * (_autoscreenshotStep + 1) - 1) {
                _screenshotRequested = true;
            }

            ++_autoscreenshotFrame;
        } else {
            _autoscreenshot = false;
            if (_autoscreenshotOutFile.is_open()) {
                _autoscreenshotOutFile << "Closing.";
                _autoscreenshotOutFile.close();
            }
        }
    }
}